

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# various_input.cpp
# Opt level: O2

void use_peek(void)

{
  undefined8 in_RAX;
  long *plVar1;
  ostream *poVar2;
  char ch;
  
  plVar1 = (long *)std::istream::get((char *)&std::cin);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    ch = (char)((ulong)in_RAX >> 0x38);
    if (ch != '#') {
      poVar2 = std::operator<<((ostream *)&std::cout,ch);
      std::operator<<(poVar2,"-");
    }
    std::istream::putback('(');
  }
  if (((byte)cos[*(long *)(std::cin + -0x18)] & 2) == 0) {
    std::istream::get((char *)&std::cin);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"EOF reached.\n");
}

Assistant:

void use_peek() {
    using namespace std;

    char ch;
    while(cin.get(ch)) {    //  stop when EOF
        if (ch != '#') {
            cout << ch << "-";
        } else {
            //  make '#' back into stream
            cin.putback(ch);
            break;
        }
    }

    if (!cin.eof()) {
        cin.get(ch);    // always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
        exit(0);
    }

    //  read until meet '#'
    while(cin.peek() != '#') {
        cin.get(ch);
        cout << ch;
    }
    if (!cin.eof()) {
        cin.get(ch);    //  always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
    }
}